

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::ProgramBinaryUniformResetCase::verifyUniformInt
          (ProgramBinaryUniformResetCase *this,ShaderProgram *program,string *name)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  GLint location;
  GLint intVar;
  GLint local_1ac;
  undefined1 local_1a8 [384];
  
  this_00 = &(this->super_ProgramBinaryCase).super_CallLogWrapper;
  location = glu::CallLogWrapper::glGetUniformLocation
                       (this_00,(program->m_program).m_program,(name->_M_dataplus)._M_p);
  local_1ac = -1;
  glu::CallLogWrapper::glGetUniformiv(this_00,(program->m_program).m_program,location,&local_1ac);
  if (local_1ac != 0) {
    local_1a8._0_8_ =
         ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    this_01 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"Fail, expected zero value for ",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,(name->_M_dataplus)._M_p,name->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", received: ",0xc);
    std::ostream::operator<<(this_01,local_1ac);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x78));
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Uniform value not reset");
  }
  return;
}

Assistant:

void verifyUniformInt (glu::ShaderProgram& program, const std::string& name)
	{
		const GLint		intLoc	= glGetUniformLocation(program.getProgram(), name.c_str());
		GLint			intVar	= -1;

		glGetUniformiv(program.getProgram(), intLoc, &intVar);

		if (intVar != 0)
		{
			m_testCtx.getLog() << TestLog::Message << "Fail, expected zero value for " << name << ", received: " << intVar << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Uniform value not reset");
		}
	}